

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llama-model.cpp
# Opt level: O2

ggml_backend_buffer_type_t __thiscall llama_model::select_buft(llama_model *this,int il)

{
  ggml_backend_device *pgVar1;
  ggml_backend_buffer_type *pgVar2;
  long lVar3;
  ggml_context_ptr gVar4;
  char cVar5;
  reference pvVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  long lVar9;
  runtime_error *prVar10;
  long lVar11;
  pointer ppVar12;
  ggml_context_ptr ctx;
  string local_70;
  pointer local_50;
  long local_48;
  undefined8 uStack_40;
  undefined1 local_38;
  
  pvVar6 = std::vector<llama_model::impl::layer_dev,_std::allocator<llama_model::impl::layer_dev>_>
           ::at(&((this->pimpl)._M_t.
                  super___uniq_ptr_impl<llama_model::impl,_std::default_delete<llama_model::impl>_>.
                  _M_t.
                  super__Tuple_impl<0UL,_llama_model::impl_*,_std::default_delete<llama_model::impl>_>
                  .super__Head_base<0UL,_llama_model::impl_*,_false>._M_head_impl)->dev_layer,
                (long)il);
  ppVar12 = (pvVar6->buft_list->
            super__Vector_base<std::pair<ggml_backend_device_*,_ggml_backend_buffer_type_*>,_std::allocator<std::pair<ggml_backend_device_*,_ggml_backend_buffer_type_*>_>_>
            )._M_impl.super__Vector_impl_data._M_start;
  local_50 = (pvVar6->buft_list->
             super__Vector_base<std::pair<ggml_backend_device_*,_ggml_backend_buffer_type_*>,_std::allocator<std::pair<ggml_backend_device_*,_ggml_backend_buffer_type_*>_>_>
             )._M_impl.super__Vector_impl_data._M_finish;
  while( true ) {
    if (ppVar12 == local_50) {
      prVar10 = (runtime_error *)__cxa_allocate_exception(0x10);
      format_abi_cxx11_(&local_70,"no suitable buffer type found");
      std::runtime_error::runtime_error(prVar10,(string *)&local_70);
      __cxa_throw(prVar10,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    pgVar1 = ppVar12->first;
    pgVar2 = ppVar12->second;
    local_48 = ggml_tensor_overhead();
    local_48 = local_48 << 3;
    uStack_40 = 0;
    local_38 = 1;
    ctx._M_t.super___uniq_ptr_impl<ggml_context,_ggml_context_deleter>._M_t.
    super__Tuple_impl<0UL,_ggml_context_*,_ggml_context_deleter>.
    super__Head_base<0UL,_ggml_context_*,_false>._M_head_impl =
         (__uniq_ptr_data<ggml_context,_ggml_context_deleter,_true,_true>)ggml_init();
    if ((tuple<ggml_context_*,_ggml_context_deleter>)
        ctx._M_t.super___uniq_ptr_impl<ggml_context,_ggml_context_deleter>._M_t.
        super__Tuple_impl<0UL,_ggml_context_*,_ggml_context_deleter>.
        super__Head_base<0UL,_ggml_context_*,_false>._M_head_impl ==
        (_Head_base<0UL,_ggml_context_*,_false>)0x0) break;
    local_70._M_dataplus._M_p = (pointer)ggml_backend_buft_alloc_buffer(pgVar2,0);
    gVar4._M_t.super___uniq_ptr_impl<ggml_context,_ggml_context_deleter>._M_t.
    super__Tuple_impl<0UL,_ggml_context_*,_ggml_context_deleter>.
    super__Head_base<0UL,_ggml_context_*,_false>._M_head_impl =
         ctx._M_t.super___uniq_ptr_impl<ggml_context,_ggml_context_deleter>._M_t.
         super__Tuple_impl<0UL,_ggml_context_*,_ggml_context_deleter>.
         super__Head_base<0UL,_ggml_context_*,_false>._M_head_impl;
    uVar7 = ggml_new_tensor_1d(ctx._M_t.super___uniq_ptr_impl<ggml_context,_ggml_context_deleter>.
                               _M_t.super__Tuple_impl<0UL,_ggml_context_*,_ggml_context_deleter>.
                               super__Head_base<0UL,_ggml_context_*,_false>._M_head_impl,0,
                               (this->hparams).n_embd);
    uVar8 = ggml_new_tensor_1d(gVar4._M_t.super___uniq_ptr_impl<ggml_context,_ggml_context_deleter>.
                               _M_t.super__Tuple_impl<0UL,_ggml_context_*,_ggml_context_deleter>.
                               super__Head_base<0UL,_ggml_context_*,_false>._M_head_impl,0,
                               (this->hparams).n_embd);
    lVar9 = ggml_add(gVar4._M_t.super___uniq_ptr_impl<ggml_context,_ggml_context_deleter>._M_t.
                     super__Tuple_impl<0UL,_ggml_context_*,_ggml_context_deleter>.
                     super__Head_base<0UL,_ggml_context_*,_false>._M_head_impl,uVar7,uVar8);
    for (lVar11 = 0x13; lVar11 != 0x1d; lVar11 = lVar11 + 1) {
      lVar3 = *(long *)(lVar9 + lVar11 * 8);
      if (lVar3 != 0) {
        *(pointer *)(lVar3 + 8) = local_70._M_dataplus._M_p;
      }
    }
    cVar5 = ggml_backend_dev_supports_op(pgVar1);
    std::unique_ptr<ggml_backend_buffer,_ggml_backend_buffer_deleter>::~unique_ptr
              ((unique_ptr<ggml_backend_buffer,_ggml_backend_buffer_deleter> *)&local_70);
    std::unique_ptr<ggml_context,_ggml_context_deleter>::~unique_ptr(&ctx);
    ppVar12 = ppVar12 + 1;
    if (cVar5 != '\0') {
      return pgVar2;
    }
  }
  prVar10 = (runtime_error *)__cxa_allocate_exception(0x10);
  format_abi_cxx11_(&local_70,"failed to create ggml context");
  std::runtime_error::runtime_error(prVar10,(string *)&local_70);
  __cxa_throw(prVar10,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

ggml_backend_buffer_type_t llama_model::select_buft(int il) const {
    return ::select_buft(
            *pimpl->dev_layer.at(il).buft_list,
            [&](ggml_context * ctx) {
                ggml_tensor * cur = ggml_new_tensor_1d(ctx, GGML_TYPE_F32, hparams.n_embd);
                ggml_tensor * layer_dir = ggml_new_tensor_1d(ctx, GGML_TYPE_F32, hparams.n_embd);
                return ggml_add(ctx, cur, layer_dir);
            });
}